

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall luna::State::FullGCRoot(State *this,GCObjectVisitor *v)

{
  bool bVar1;
  iterator this_00;
  iterator v_00;
  reference pCVar2;
  list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *in_RDI;
  CallInfo *call;
  iterator __end1_1;
  iterator __begin1_1;
  list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *__range1_1;
  Value *value;
  iterator __end1;
  iterator __begin1;
  vector<luna::Value,_std::allocator<luna::Value>_> *__range1;
  __normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
  *in_stack_ffffffffffffffb0;
  _Self in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  __normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_> local_20
  ;
  pointer *local_18;
  
  Value::Accept((Value *)in_stack_ffffffffffffffc0._M_node,
                (GCObjectVisitor *)in_stack_ffffffffffffffb8._M_node);
  local_18 = &((_Vector_impl_data *)
              &in_RDI[1].super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
               _M_node)->_M_end_of_storage;
  local_20._M_current =
       (Value *)std::vector<luna::Value,_std::allocator<luna::Value>_>::begin
                          ((vector<luna::Value,_std::allocator<luna::Value>_> *)in_RDI);
  std::vector<luna::Value,_std::allocator<luna::Value>_>::end
            ((vector<luna::Value,_std::allocator<luna::Value>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>::
    operator*(&local_20);
    Value::Accept((Value *)in_stack_ffffffffffffffc0._M_node,
                  (GCObjectVisitor *)in_stack_ffffffffffffffb8._M_node);
    __gnu_cxx::
    __normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>::
    operator++(&local_20);
  }
  this_00 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::begin(in_RDI);
  v_00 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc0,(_Self *)&stack0xffffffffffffffb8);
    if (!bVar1) break;
    pCVar2 = std::_List_iterator<luna::CallInfo>::operator*
                       ((_List_iterator<luna::CallInfo> *)0x168599);
    Value::Accept((Value *)this_00._M_node,(GCObjectVisitor *)v_00._M_node);
    if (pCVar2->func_ != (Value *)0x0) {
      Value::Accept((Value *)this_00._M_node,(GCObjectVisitor *)v_00._M_node);
    }
    std::_List_iterator<luna::CallInfo>::operator++
              ((_List_iterator<luna::CallInfo> *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void State::FullGCRoot(GCObjectVisitor *v)
    {
        // Visit global table
        global_.Accept(v);

        // Visit stack values
        for (const auto &value : stack_.stack_)
        {
            value.Accept(v);
        }

        // Visit call info
        for (const auto &call : calls_)
        {
            call.register_->Accept(v);
            if (call.func_)
            {
                call.func_->Accept(v);
            }
        }
    }